

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

void __thiscall semver::version<short,_short,_short>::~version(version<short,_short,_short> *this)

{
  std::
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ::~vector(&this->prerelease_identifiers);
  std::__cxx11::string::~string((string *)&this->build_metadata_);
  std::__cxx11::string::~string((string *)&this->prerelease_tag_);
  return;
}

Assistant:

SEMVER_CONSTEXPR ~version() = default;